

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsGetOwnPropertySymbols(JsValueRef object,JsValueRef *propertySymbols)

{
  anon_class_16_2_cc547b32 fn;
  JsErrorCode JVar1;
  JsValueRef *local_18;
  JsValueRef *propertySymbols_local;
  JsValueRef object_local;
  
  fn.propertySymbols = &local_18;
  fn.object = &propertySymbols_local;
  local_18 = propertySymbols;
  propertySymbols_local = (JsValueRef *)object;
  JVar1 = ContextAPIWrapper<false,JsGetOwnPropertySymbols::__0>(fn);
  return JVar1;
}

Assistant:

CHAKRA_API JsGetOwnPropertySymbols(_In_ JsValueRef object, _Out_ JsValueRef *propertySymbols)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTGetOwnPropertySymbolsInfo, object);

        VALIDATE_INCOMING_OBJECT(object, scriptContext);
        PARAM_NOT_NULL(propertySymbols);

        *propertySymbols = Js::JavascriptOperators::GetOwnPropertySymbols(object, scriptContext);
        Assert(*propertySymbols == nullptr || !Js::CrossSite::NeedMarshalVar(*propertySymbols, scriptContext));

        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, propertySymbols);

        return JsNoError;
    });
}